

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O1

char * CaptureHashCount(char *szDataPtr,char *szDataEnd,size_t *PtrHashCount)

{
  byte *pbVar1;
  size_t in_RCX;
  size_t sVar2;
  BYTE HashValue [16];
  BYTE aBStack_38 [24];
  
  if (szDataPtr < szDataEnd) {
    sVar2 = 0;
    do {
      pbVar1 = (byte *)CaptureSingleHash(szDataPtr,szDataEnd,aBStack_38,in_RCX);
      if (pbVar1 == (byte *)0x0) {
        return (char *)0x0;
      }
      szDataPtr = (char *)pbVar1;
      if (pbVar1 < szDataEnd) {
        in_RCX = (long)szDataEnd - (long)pbVar1;
        do {
          szDataPtr = (char *)pbVar1;
          if (0x20 < *pbVar1) break;
          pbVar1 = pbVar1 + 1;
          in_RCX = in_RCX - 1;
          szDataPtr = szDataEnd;
        } while (in_RCX != 0);
      }
      sVar2 = sVar2 + 1;
    } while (szDataPtr < szDataEnd);
  }
  else {
    sVar2 = 0;
  }
  *PtrHashCount = sVar2;
  return (char *)(byte *)szDataPtr;
}

Assistant:

static const char * CaptureHashCount(const char * szDataPtr, const char * szDataEnd, size_t * PtrHashCount)
{
    BYTE HashValue[MD5_HASH_SIZE];
    size_t HashCount = 0;

    // Capculate the hash count
    while (szDataPtr < szDataEnd)
    {
        // Check one hash
        szDataPtr = CaptureSingleHash(szDataPtr, szDataEnd, HashValue, MD5_HASH_SIZE);
        if (szDataPtr == NULL)
            return NULL;

        // Skip all whitespaces
        while (szDataPtr < szDataEnd && IsWhiteSpace(szDataPtr))
            szDataPtr++;

        HashCount++;
    }

    // Give results
    PtrHashCount[0] = HashCount;
    return szDataPtr;
}